

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

size_t linenoiseUtf8NextCharLen(char *buf,size_t buf_len,size_t pos,size_t *col_len)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t len;
  size_t sStack_38;
  int cp;
  size_t beg;
  size_t *col_len_local;
  size_t pos_local;
  size_t buf_len_local;
  char *buf_local;
  
  sStack_38 = pos;
  beg = (size_t)col_len;
  col_len_local = (size_t *)pos;
  pos_local = buf_len;
  buf_len_local = (size_t)buf;
  sVar3 = utf8BytesToCodePoint(buf + pos,buf_len - pos,(int *)((long)&len + 4));
  iVar1 = isCombiningChar((long)len._4_4_);
  if (iVar1 == 0) {
    if (beg != 0) {
      iVar1 = isWideChar((long)len._4_4_);
      iVar2 = 1;
      if (iVar1 != 0) {
        iVar2 = 2;
      }
      *(long *)beg = (long)iVar2;
    }
    for (col_len_local = (size_t *)(sVar3 + (long)col_len_local); col_len_local < pos_local;
        col_len_local = (size_t *)(sVar3 + (long)col_len_local)) {
      sVar3 = utf8BytesToCodePoint
                        ((char *)(buf_len_local + (long)col_len_local),
                         pos_local - (long)col_len_local,(int *)((long)&len + 4));
      iVar1 = isCombiningChar((long)len._4_4_);
      if (iVar1 == 0) {
        return (long)col_len_local - sStack_38;
      }
    }
    buf_local = (char *)((long)col_len_local - sStack_38);
  }
  else {
    buf_local = (char *)0x0;
  }
  return (size_t)buf_local;
}

Assistant:

size_t linenoiseUtf8NextCharLen(const char* buf, size_t buf_len, size_t pos, size_t *col_len) {
    size_t beg = pos;
    int cp;
    size_t len = utf8BytesToCodePoint(buf + pos, buf_len - pos, &cp);
    if (isCombiningChar(cp)) {
        /* NOTREACHED */
        return 0;
    }
    if (col_len != NULL) *col_len = isWideChar(cp) ? 2 : 1;
    pos += len;
    while (pos < buf_len) {
        len = utf8BytesToCodePoint(buf + pos, buf_len - pos, &cp);
        if (!isCombiningChar(cp)) return pos - beg;
        pos += len;
    }
    return pos - beg;
}